

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcole.c
# Opt level: O2

int ffr4fi4(float *input,long ntodo,double scale,double zero,int *output,int *status)

{
  float fVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  
  lVar2 = 0;
  if (0 < ntodo) {
    lVar2 = ntodo;
  }
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      dVar5 = ((double)input[lVar3] - zero) / scale;
      if (-2147483648.49 <= dVar5) {
        if (dVar5 <= 2147483647.49) {
          if (0.0 <= dVar5) {
            dVar5 = dVar5 + 0.5;
          }
          else {
            dVar5 = dVar5 + -0.5;
          }
          iVar4 = (int)dVar5;
        }
        else {
          *status = -0xb;
          iVar4 = 0x7fffffff;
        }
      }
      else {
        *status = -0xb;
        iVar4 = -0x80000000;
      }
      output[lVar3] = iVar4;
    }
  }
  else {
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      fVar1 = input[lVar3];
      if (-2.1474836e+09 <= fVar1) {
        if (fVar1 <= 2.1474836e+09) {
          iVar4 = (int)fVar1;
        }
        else {
          *status = -0xb;
          iVar4 = 0x7fffffff;
        }
      }
      else {
        *status = -0xb;
        iVar4 = -0x80000000;
      }
      output[lVar3] = iVar4;
    }
  }
  return *status;
}

Assistant:

int ffr4fi4(float *input,      /* I - array of values to be converted  */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            INT32BIT *output,  /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required.
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
        {
            if (input[ii] < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MIN;
            }
            else if (input[ii] > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MAX;
            }
            else
                output[ii] = (INT32BIT) input[ii];
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    output[ii] = (INT32BIT) (dvalue + .5);
                else
                    output[ii] = (INT32BIT) (dvalue - .5);
            }
        }
    }
    return(*status);
}